

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::ElementDocument(ElementDocument *this,String *tag)

{
  Property local_70;
  
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementDocument_003978a8;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->source_url)._M_dataplus._M_p = (pointer)&(this->source_url).field_2;
  (this->source_url)._M_string_length = 0;
  (this->source_url).field_2._M_local_buf[0] = '\0';
  (this->style_sheet_container).
  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->style_sheet_container).
  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->style_sheet_container).
           super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 2) = 0;
  *(undefined8 *)((long)&this->context + 2) = 0;
  this->layout_dirty = true;
  this->position_dirty = false;
  Element::ForceLocalStackingContext(&this->super_Element);
  Element::SetOwnerDocument(&this->super_Element,this);
  Property::Property<Rml::Style::Position,Rml::Style::Position>(&local_70,Absolute);
  Element::SetProperty(&this->super_Element,Position,&local_70);
  Property::~Property(&local_70);
  return;
}

Assistant:

ElementDocument::ElementDocument(const String& tag) : Element(tag)
{
	context = nullptr;

	modal = false;
	focusable_from_modal = false;

	layout_dirty = true;
	position_dirty = false;

	ForceLocalStackingContext();
	SetOwnerDocument(this);

	SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
}